

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O3

bool __thiscall create::Create::updateLEDs(Create *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  int in_R8D;
  uint8_t cmd [4];
  undefined1 local_4 [4];
  
  sVar1 = Serial::send((this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(int)local_4,(void *)0x4,in_RCX,in_R8D);
  return SUB81(sVar1,0);
}

Assistant:

bool Create::updateLEDs() {
    uint8_t LEDByte = debrisLED + spotLED + dockLED + checkLED;
    uint8_t cmd[4] = { OC_LEDS,
                       LEDByte,
                       powerLED,
                       powerLEDIntensity
                     };

    return serial->send(cmd, 4);
  }